

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

_Bool NES_APU_np_Read(void *chip,UINT16 adr,UINT8 *val)

{
  byte bVar1;
  NES_APU *apu;
  UINT8 *val_local;
  UINT16 adr_local;
  void *chip_local;
  
  if ((adr < 0x4000) || (0x4007 < adr)) {
    if (adr == 0x4015) {
      bVar1 = 0;
      if (*(int *)((long)chip + 0x15c) != 0) {
        bVar1 = 2;
      }
      *val = *val | bVar1 | *(int *)((long)chip + 0x158) != 0;
      chip_local._7_1_ = true;
    }
    else {
      chip_local._7_1_ = false;
    }
  }
  else {
    *val = *val | *(byte *)((long)chip + (long)(int)(adr & 7) + 0x34);
    chip_local._7_1_ = true;
  }
  return chip_local._7_1_;
}

Assistant:

bool NES_APU_np_Read(void* chip, UINT16 adr, UINT8* val)
{
	NES_APU* apu = (NES_APU*)chip;

	if (0x4000 <= adr && adr < 0x4008)
	{
		*val |= apu->reg[adr&0x7];
		return true;
	}
	else if(adr==0x4015)
	{
		*val |= (apu->length_counter[1]?2:0)|(apu->length_counter[0]?1:0);
		return true;
	}
	else
		return false;
}